

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

uint64_t helper_float_sub_d_mips64(CPUMIPSState_conflict5 *env,uint64_t fdt0,uint64_t fdt1)

{
  float64 fVar1;
  uintptr_t unaff_retaddr;
  uint64_t dt2;
  uint64_t fdt1_local;
  uint64_t fdt0_local;
  CPUMIPSState_conflict5 *env_local;
  
  fVar1 = float64_sub_mips64(fdt0,fdt1,&(env->active_fpu).fp_status);
  update_fcr31(env,unaff_retaddr);
  return fVar1;
}

Assistant:

FLOAT_BINOP(add)
FLOAT_BINOP(sub)
FLOAT_BINOP(mul)
FLOAT_BINOP(div)
#undef FLOAT_BINOP

/* MIPS specific binary operations */
uint64_t helper_float_recip2_d(CPUMIPSState *env, uint64_t fdt0, uint64_t fdt2)
{
    fdt2 = float64_mul(fdt0, fdt2, &env->active_fpu.fp_status);
    fdt2 = float64_chs(float64_sub(fdt2, float64_one,
                                   &env->active_fpu.fp_status));
    update_fcr31(env, GETPC());
    return fdt2;
}